

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanomsg_source.cc
# Opt level: O1

int Nanomsg::open(char *__file,int __oflag,...)

{
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  char *pcVar4;
  ostream *poVar5;
  runtime_error *prVar6;
  char *pcVar7;
  int size;
  stringstream ss;
  string local_1d0 [36];
  int local_1ac;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  iVar1 = nn_socket(1,0x21);
  if (iVar1 < 0) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(local_198,"nn_socket: ",0xb);
    iVar1 = nn_errno();
    pcVar7 = nn_strerror(iVar1);
    std::operator<<(local_198,pcVar7);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,local_1d0);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar7 = *(char **)(___oflag + 0xb8);
  iVar2 = nn_connect(iVar1,pcVar7);
  if (iVar2 < 0) {
    nn_close(iVar1);
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(local_198,"nn_connect: ",0xc);
    iVar1 = nn_errno();
    pcVar4 = nn_strerror(iVar1);
    std::operator<<(local_198,pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>(local_198," (",2);
    poVar5 = std::operator<<(local_198,pcVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,local_1d0);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1ac = *(int *)(___oflag + 0xd8);
  if (0 < local_1ac) {
    iVar2 = nn_setsockopt(iVar1,0,2,&local_1ac,4);
    if (iVar2 < 0) {
      nn_close(iVar1);
      std::__cxx11::stringstream::stringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(local_198,"nn_setsockopt: ",0xf);
      iVar1 = nn_errno();
      pcVar7 = nn_strerror(iVar1);
      std::operator<<(local_198,pcVar7);
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,local_1d0);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  iVar2 = nn_setsockopt(iVar1,0x21,1,"",0);
  if (-1 < iVar2) {
    puVar3 = (undefined8 *)operator_new(0x38);
    *puVar3 = &PTR__Nanomsg_001874c8;
    *(int *)(puVar3 + 1) = iVar1;
    puVar3[2] = 0;
    puVar3[4] = 0;
    puVar3[5] = 0;
    puVar3[6] = 0;
    *(undefined8 **)__file = puVar3;
    return (int)__file;
  }
  nn_close(iVar1);
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"nn_setsockopt: ",0xf);
  iVar1 = nn_errno();
  pcVar4 = nn_strerror(iVar1);
  std::operator<<(local_198,pcVar4);
  std::__ostream_insert<char,std::char_traits<char>>(local_198," (",2);
  poVar5 = std::operator<<(local_198,pcVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar6,local_1d0);
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::unique_ptr<Nanomsg> Nanomsg::open(const Config& config) {
  int rv;

  auto fd = nn_socket(AF_SP, NN_SUB);
  if (fd < 0) {
    std::stringstream ss;
    ss << "nn_socket: " << nn_strerror(nn_errno());
    throw std::runtime_error(ss.str());
  }

  const char* url = config.nanomsg.connect.c_str();
  rv = nn_connect(fd, url);
  if (rv < 0) {
    nn_close(fd);
    std::stringstream ss;
    ss << "nn_connect: " << nn_strerror(nn_errno());
    ss << " (" << url << ")";
    throw std::runtime_error(ss.str());
  }

  int size = config.nanomsg.receiveBuffer;
  if (size > 0) {
    rv = nn_setsockopt(fd, NN_SOL_SOCKET, NN_SNDBUF, &size, sizeof(size));
    if (rv < 0) {
      nn_close(fd);
      std::stringstream ss;
      ss << "nn_setsockopt: " << nn_strerror(nn_errno());
      throw std::runtime_error(ss.str());
    }
  }

  rv = nn_setsockopt(fd, NN_SUB, NN_SUB_SUBSCRIBE, "", 0);
  if (rv < 0) {
    nn_close(fd);
    std::stringstream ss;
    ss << "nn_setsockopt: " << nn_strerror(nn_errno());
    ss << " (" << url << ")";
    throw std::runtime_error(ss.str());
  }

  return std::make_unique<Nanomsg>(fd);
}